

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

void scroll_group_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,Am_Slot_Key slot)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object scroll_group;
  Am_Object scroll_bar;
  undefined1 local_38 [8];
  Am_Value old_value;
  Am_Value new_value;
  Am_Slot_Key slot_local;
  bool selective_local;
  bool undo_local;
  Am_Object *command_obj_local;
  
  Am_Value::Am_Value((Am_Value *)&old_value.value);
  Am_Value::Am_Value((Am_Value *)local_38);
  Am_Object::Am_Object(&scroll_group);
  Am_Object::Am_Object(&local_58);
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&scroll_group,pAVar2);
  Am_Object::Get_Owner(&local_60,(Am_Slot_Flags)&scroll_group);
  Am_Object::operator=(&local_58,&local_60);
  Am_Object::~Am_Object(&local_60);
  bVar1 = Am_Object::Valid(&local_58);
  if (bVar1) {
    if (selective) {
      pAVar2 = Am_Object::Peek(&scroll_group,0x169,0);
      Am_Value::operator=((Am_Value *)&old_value.value,pAVar2);
    }
    else {
      pAVar2 = Am_Object::Peek(command_obj,0x169,0);
      Am_Value::operator=((Am_Value *)&old_value.value,pAVar2);
    }
    if (undo) {
      pAVar2 = Am_Object::Peek(command_obj,0x16c,0);
      Am_Value::operator=((Am_Value *)local_38,pAVar2);
    }
    else {
      pAVar2 = Am_Object::Peek(command_obj,0x169,0);
      Am_Value::operator=((Am_Value *)local_38,pAVar2);
    }
    Am_Object::Set(command_obj,0x16c,(Am_Value *)&old_value.value,0);
    Am_Object::Set(command_obj,0x169,(Am_Value *)local_38,0);
    bVar1 = Am_Object::Valid(&local_58);
    if (bVar1) {
      Am_Object::Set(&local_58,slot,(Am_Value *)local_38,0);
    }
  }
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&scroll_group);
  Am_Value::~Am_Value((Am_Value *)local_38);
  Am_Value::~Am_Value((Am_Value *)&old_value.value);
  return;
}

Assistant:

void
scroll_group_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                               Am_Slot_Key slot)
{
  Am_Value new_value, old_value;
  Am_Object scroll_bar, scroll_group;
  scroll_bar = command_obj.Get(Am_SAVED_OLD_OWNER);
  scroll_group = scroll_bar.Get_Owner();
  if (scroll_group.Valid()) {

    if (selective) // then get current value from the scroll_bar
      new_value = scroll_bar.Peek(Am_VALUE);
    else // get current value from the command_obj
      new_value = command_obj.Peek(Am_VALUE);

    if (undo)
      old_value = command_obj.Peek(Am_OLD_VALUE);
    else // repeat
      old_value = command_obj.Peek(Am_VALUE);

    command_obj.Set(Am_OLD_VALUE, new_value);
    command_obj.Set(Am_VALUE, old_value);
    //also set scroll group
    if (scroll_group.Valid()) {
      scroll_group.Set(slot, old_value);
    }
  }
}